

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>
               (long array,int size)

{
  undefined4 uVar1;
  bool bVar2;
  int local_28;
  Lit tmp;
  int best_i;
  int j;
  int i;
  int size_local;
  Lit *array_local;
  
  for (best_i = 0; best_i < size + -1; best_i = best_i + 1) {
    local_28 = best_i;
    tmp.x = best_i;
    while (tmp.x = tmp.x + 1, tmp.x < size) {
      bVar2 = LessThan_default<Minisat::Lit>::operator()
                        ((LessThan_default<Minisat::Lit> *)((long)&array_local + 7),
                         (Lit)*(int *)(array + (long)tmp.x * 4),
                         (Lit)*(int *)(array + (long)local_28 * 4));
      if (bVar2) {
        local_28 = tmp.x;
      }
    }
    uVar1 = *(undefined4 *)(array + (long)best_i * 4);
    *(undefined4 *)(array + (long)best_i * 4) = *(undefined4 *)(array + (long)local_28 * 4);
    *(undefined4 *)(array + (long)local_28 * 4) = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}